

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O0

ExpressionTree * __thiscall
ORPG::ExpressionTree::tree_string(ExpressionTree *this,parse_node *node,int indent,string *pre)

{
  parse_node *ppVar1;
  int iVar2;
  undefined4 in_register_00000014;
  parse_node *ppVar3;
  allocator local_199;
  string local_198 [32];
  undefined1 local_178 [40];
  string local_150 [32];
  undefined1 local_130 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [34];
  allocator local_6e;
  undefined1 local_6d;
  allocator local_59;
  string local_58 [8];
  string pad;
  int local_34;
  int i;
  string *pre_local;
  int indent_local;
  parse_node *node_local;
  ExpressionTree *this_local;
  string *ret;
  
  ppVar3 = (parse_node *)CONCAT44(in_register_00000014,indent);
  iVar2 = (int)pre;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_6d = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_6e);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e);
  for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
    std::__cxx11::string::operator+=(local_58," ");
  }
  std::operator+(local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58);
  std::operator+(local_d0,(char *)local_f0);
  node_to_string_abi_cxx11_((ORPG *)(local_130 + 0x20),ppVar3);
  std::operator+(local_b0,local_d0);
  std::operator+(local_90,(char *)local_b0);
  std::__cxx11::string::operator=((string *)this,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)(local_130 + 0x20));
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_f0);
  if (ppVar3->left != (parse_node *)0x0) {
    ppVar1 = ppVar3->left;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"left->",(allocator *)(local_178 + 0x27));
    tree_string((ExpressionTree *)local_130,node,(int)ppVar1,(string *)(ulong)(iVar2 + 2));
    std::__cxx11::string::operator+=((string *)this,(string *)local_130);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)(local_178 + 0x27));
  }
  if (ppVar3->right != (parse_node *)0x0) {
    ppVar3 = ppVar3->right;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"right->",&local_199);
    tree_string((ExpressionTree *)local_178,node,(int)ppVar3,(string *)(ulong)(iVar2 + 2));
    std::__cxx11::string::operator+=((string *)this,(string *)local_178);
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
  }
  local_6d = 1;
  std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

string ExpressionTree::tree_string(struct parse_node* node, int indent, string pre) {
        int i;
        string pad("");
        string ret("");

        for(i = 0; i < indent; i++) pad += " ";

        ret = pad + pre + "(" + node_to_string(node) +")\n";

        if(node->left != NULL)  ret += tree_string(node->left, indent + 2, "left->");
        if(node->right != NULL) ret += tree_string(node->right, indent + 2, "right->");

        return ret;
    }